

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathBox.h
# Opt level: O2

Vec4<long> * __thiscall
Imath_3_2::Box<Imath_3_2::Vec4<long>_>::center
          (Vec4<long> *__return_storage_ptr__,Box<Imath_3_2::Vec4<long>_> *this)

{
  ulong uVar1;
  ulong uVar2;
  long local_38;
  long lStack_30;
  long local_28;
  long lStack_20;
  
  Vec4<long>::operator+(&this->max,&this->min);
  uVar1 = local_38 - (local_38 >> 0x3f);
  uVar2 = lStack_30 - (lStack_30 >> 0x3f);
  __return_storage_ptr__->x = CONCAT44((int)((long)uVar1 >> 0x21),(int)(uVar1 >> 1));
  *(int *)&__return_storage_ptr__->z = (int)(uVar2 >> 1);
  *(int *)((long)&__return_storage_ptr__->z + 4) = (int)((long)uVar2 >> 0x21);
  uVar1 = local_28 - (local_28 >> 0x3f);
  uVar2 = lStack_20 - (lStack_20 >> 0x3f);
  __return_storage_ptr__->z = CONCAT44((int)((long)uVar1 >> 0x21),(int)(uVar1 >> 1));
  *(int *)&__return_storage_ptr__[1].x = (int)(uVar2 >> 1);
  *(int *)((long)&__return_storage_ptr__[1].x + 4) = (int)((long)uVar2 >> 0x21);
  return __return_storage_ptr__;
}

Assistant:

IMATH_HOSTDEVICE constexpr inline V
Box<V>::center () const IMATH_NOEXCEPT
{
    return (max + min) / 2;
}